

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::
ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
           *this)

{
  CStringRef arg0;
  int iVar1;
  int iVar2;
  undefined8 *in_RDI;
  int index;
  int i;
  AlgebraicConHandler vh;
  int num_values;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  BinaryReader<mp::internal::EndiannessConverter> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint ub;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::ItemType)2>
  in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                    ((BinaryReader<mp::internal::EndiannessConverter> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  ::AlgebraicConHandler::AlgebraicConHandler
            ((AlgebraicConHandler *)in_stack_ffffffffffffffc0,
             (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
              *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar3 = iVar1;
  iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
          ::AlgebraicConHandler::num_items((AlgebraicConHandler *)&stack0xffffffffffffffe8);
  if (iVar2 < iVar1) {
    in_stack_ffffffffffffffc0 = (BinaryReader<mp::internal::EndiannessConverter> *)*in_RDI;
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"too many initial values");
    arg0.data_._4_4_ = iVar3;
    arg0.data_._0_4_ = in_stack_fffffffffffffff0;
    BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_ffffffffffffffe8.reader_,arg0);
  }
  BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  for (ub = 0; (int)ub < iVar3; ub = ub + 1) {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::AlgebraicConHandler::num_items((AlgebraicConHandler *)&stack0xffffffffffffffe8);
    iVar1 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
            ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                        *)in_stack_ffffffffffffffe0.data_,ub);
    BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(in_stack_ffffffffffffffc0);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::AlgebraicConHandler::SetInitialValue
              ((AlgebraicConHandler *)in_stack_ffffffffffffffc0,iVar1,1.11636158346978e-317);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}